

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_with_texture.c
# Opt level: O3

void prf_vertex_with_texture_fill_vertex(prf_node_t *node,prf_vertex_t *vertex)

{
  float64_t *pfVar1;
  ushort uVar2;
  uint uVar3;
  undefined8 uVar4;
  
  if (node->opcode != prf_vertex_with_texture_info.opcode) {
    prf_error(9,"vertex with texture: fill from node of type %d.");
    return;
  }
  uVar2 = node->length;
  uVar4 = 4;
  if (5 < uVar2) {
    pfVar1 = (float64_t *)node->data;
    vertex->color_name_index = *(uint16_t *)(pfVar1 + 3);
    uVar4 = 6;
    if (7 < uVar2) {
      vertex->flags = *(uint16_t *)((long)pfVar1 + 0x1a);
      uVar4 = 8;
      if (0xf < uVar2) {
        vertex->x = *pfVar1;
        uVar4 = 0x10;
        if (0x17 < uVar2) {
          vertex->y = pfVar1[1];
          uVar4 = 0x18;
          if (0x1f < uVar2) {
            vertex->z = pfVar1[2];
            uVar4 = 0x20;
            if (0x23 < uVar2) {
              vertex->texture[0] = *(float32_t *)((long)pfVar1 + 0x1c);
              uVar4 = 0x24;
              if (0x27 < uVar2) {
                vertex->texture[1] = *(float32_t *)(pfVar1 + 4);
                vertex->has_texture = 1;
                uVar4 = 0x28;
                if (0x2b < uVar2) {
                  vertex->packed_color = *(uint32_t *)((long)pfVar1 + 0x24);
                  uVar3 = 0x2c;
                  if (0x2f < uVar2) {
                    vertex->color_index = *(uint32_t *)(pfVar1 + 5);
                    uVar3 = 0x30;
                  }
                  goto LAB_0010b522;
                }
              }
            }
          }
        }
      }
    }
  }
  uVar3 = (uint)uVar4;
  prf_warn(1,"stores only %d bytes in vertex with texture",uVar4);
  uVar2 = node->length;
LAB_0010b522:
  if (uVar3 < uVar2) {
    prf_warn(1,"vertex with texture is larger than %d bytes (%d)",(ulong)uVar3);
    return;
  }
  return;
}

Assistant:

void
prf_vertex_with_texture_fill_vertex(
    prf_node_t * node,
    prf_vertex_t * vertex )
{
    int pos = 4;
    bool_t complete = FALSE;

    assert( node != NULL && vertex != NULL );

    if ( node->opcode != prf_vertex_with_texture_info.opcode ) {
        prf_error( 9, "vertex with texture: fill from node of type %d.",
            node->opcode );
        return;
    }

    do {
        node_data * data = (node_data *) node->data;
        if ( node->length < (pos + 2) ) break;
        vertex->color_name_index = data->color_name_index; pos += 2;
        if ( node->length < (pos + 2) ) break;
        vertex->flags = data->flags; pos += 2;
        if ( node->length < (pos + 8) ) break;
        prf_dblcpy( vertex->x, data->x ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblcpy( vertex->y, data->y ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblcpy( vertex->z, data->z ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        vertex->texture[0] = data->texture[0]; pos += 4;
        if ( node->length < (pos + 4) ) break;
        vertex->texture[1] = data->texture[1]; pos += 4;
        vertex->has_texture = TRUE;
        if ( node->length < (pos + 4) ) break;
        vertex->packed_color = data->packed_color; pos += 4;
        complete = TRUE;
        if ( node->length < (pos + 4) ) break;
        vertex->color_index = data->color_index; pos += 4;
        complete = TRUE;
    } while ( FALSE );

    if ( ! complete )
        prf_warn( 1, "stores only %d bytes in vertex with texture", pos );
    /* padding can't be dealt with, but should be notified, though  */
    if ( pos < node->length )
        prf_warn( 1, "vertex with texture is larger than %d bytes (%d)",
            pos, node->length );

}